

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeVoidType(Builder *this)

{
  Id IVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  Instruction *this_00;
  mapped_type_conflict *pmVar4;
  reference ppIVar5;
  key_type local_34;
  value_type local_30;
  key_type local_24;
  Id local_20;
  key_type local_1c;
  Id typeId;
  Instruction *type;
  Builder *this_local;
  
  local_1c = 0x13;
  type = (Instruction *)this;
  pmVar2 = std::
           unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
           ::operator[](&this->groupedTypes,&local_1c);
  sVar3 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar2);
  if (sVar3 == 0) {
    local_20 = getUniqueId(this);
    this_00 = (Instruction *)::operator_new(0x60);
    spv::Instruction::Instruction(this_00,local_20,0,OpTypeVoid);
    local_24 = 0x13;
    _typeId = this_00;
    pmVar2 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,&local_24);
    std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
              (pmVar2,(value_type *)&typeId);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
               _typeId);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,&local_30);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_30);
    Module::mapInstruction(&this->module,_typeId);
    IVar1 = local_20;
    if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
      pmVar4 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,&local_20);
      *pmVar4 = IVar1;
    }
  }
  else {
    local_34 = 0x13;
    pmVar2 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,&local_34);
    ppIVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::back(pmVar2);
    _typeId = *ppIVar5;
  }
  IVar1 = spv::Instruction::getResultId(_typeId);
  return IVar1;
}

Assistant:

Id Builder::makeVoidType()
{
    Instruction* type;
    if (groupedTypes[OpTypeVoid].size() == 0) {
        Id typeId = getUniqueId();
        type = new Instruction(typeId, NoType, OpTypeVoid);
        groupedTypes[OpTypeVoid].push_back(type);
        constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
        module.mapInstruction(type);
        // Core OpTypeVoid used for debug void type
        if (emitNonSemanticShaderDebugInfo)
            debugId[typeId] = typeId;
    } else
        type = groupedTypes[OpTypeVoid].back();

    return type->getResultId();
}